

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O1

void log_naughty(CHAR_DATA *ch,char *argument,int logtype)

{
  char *__s;
  size_t sVar1;
  FILE *__stream;
  uint uVar2;
  
  __s = ctime(&current_time);
  sVar1 = strlen(__s);
  __s[sVar1 - 1] = '\0';
  __stream = fopen("../logs/glog.txt","a");
  if (__stream != (FILE *)0x0) {
    uVar2 = logtype - 1;
    if ((uVar2 < 5) && ((0x17U >> (uVar2 & 0x1f) & 1) != 0)) {
      fprintf(__stream,&DAT_0038f7e4 + *(int *)(&DAT_0038f7e4 + (ulong)uVar2 * 4),__s,ch->name,
              argument);
    }
    fclose(__stream);
    return;
  }
  return;
}

Assistant:

void log_naughty(CHAR_DATA *ch, char *argument, int logtype)
{
	FILE *fp;
	char *strtime;

	strtime = ctime(&current_time);
	strtime[strlen(strtime) - 1] = '\0';

	fp = fopen(GOD_LOG_FILE, "a");

	if (fp != nullptr)
	{
		if (logtype == 1)
			fprintf(fp, "%s: LOAD- %s is loading %s.\n", strtime, ch->name, argument);

		if (logtype == 2)
			fprintf(fp, "%s: SET- %s is setting %s.\n", strtime, ch->name, argument);

		if (logtype == 3)
			fprintf(fp, "%s: STRING- %s is stringing %s.\n", strtime, ch->name, argument);

		if (logtype == 5)
			fprintf(fp, "%s: INDUCT- %s is inducting %s.\n", strtime, ch->name, argument);

		fclose(fp);
	}
}